

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

void Tas_ManDeriveReason(Tas_Man_t *p,int Level)

{
  Tas_Que_t *p_00;
  Vec_Ptr_t *pVVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  int iVar4;
  void **ppvVar5;
  Gia_Obj_t **ppGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int local_44;
  
  lVar11 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar11] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2f9,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  lVar11 = lVar11 + 1;
  iVar4 = (p->pClauses).iTail;
  local_44 = (int)lVar11;
  if (iVar4 <= local_44) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2fa,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  p_00 = &p->pClauses;
  p->vTemp->nSize = 0;
  do {
    ppGVar6 = (p->pClauses).pData;
    if (iVar4 <= lVar11) {
      if (ppGVar6[p_00->iHead] == (Gia_Obj_t *)0x0) {
        __assert_fail("pQue->pData[pQue->iHead] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                      ,0x339,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
      }
      (p->pClauses).iTail = local_44;
      for (iVar4 = 0; iVar4 < p->vTemp->nSize; iVar4 = iVar4 + 1) {
        puVar9 = (ulong *)Vec_PtrEntry(p->vTemp,iVar4);
        *puVar9 = *puVar9 & 0x7fffffffffffffff;
      }
      return;
    }
    pGVar8 = ppGVar6[lVar11];
    if (-1 < *(long *)pGVar8) {
      *(long *)pGVar8 = *(long *)pGVar8 + -0x8000000000000000;
      pVVar1 = p->vTemp;
      iVar4 = pVVar1->nSize;
      if (iVar4 == pVVar1->nCap) {
        uVar13 = iVar4 * 2;
        if (iVar4 < 0x10) {
          uVar13 = 0x10;
        }
        if (iVar4 < (int)uVar13) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar13 << 3);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar1->pArray,(ulong)uVar13 << 3);
            iVar4 = pVVar1->nSize;
          }
          pVVar1->pArray = ppvVar5;
          pVVar1->nCap = uVar13;
        }
      }
      pVVar1->nSize = iVar4 + 1;
      pVVar1->pArray[iVar4] = pGVar8;
      iVar4 = Tas_VarDecLevel(p,pGVar8);
      if (iVar4 < Level) {
        ppGVar6 = (p->pClauses).pData;
        lVar10 = (long)local_44;
        local_44 = local_44 + 1;
LAB_0057259b:
        ppGVar6[lVar10] = pGVar8;
      }
      else {
        if (iVar4 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x318,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
        }
        if (pGVar8->Value == 0xffffffff) {
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x88,"int Tas_VarHasReasonCls(Tas_Man_t *, Gia_Obj_t *)");
        }
        iVar4 = Vec_IntEntry(p->vLevReas,pGVar8->Value * 3 + 1);
        if ((iVar4 == 0) && (iVar4 = Vec_IntEntry(p->vLevReas,pGVar8->Value * 3 + 2), iVar4 != 0)) {
          if (pGVar8->Value == 0xffffffff) {
            __assert_fail("pVar->Value != ~0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x89,"Tas_Cls_t *Tas_VarReasonCls(Tas_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = Vec_IntEntry(p->vLevReas,pGVar8->Value * 3 + 2);
          pGVar2 = p->pAig;
          piVar3 = (p->pStore).pData;
          lVar10 = (long)iVar4;
          iVar4 = Abc_Lit2Var(piVar3[lVar10 + 3]);
          pGVar7 = Gia_ManObj(pGVar2,iVar4);
          if (pGVar7 != pGVar8) {
            __assert_fail("pReason == pObj",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x31d,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
          }
          for (lVar12 = 4; lVar12 + -3 < (long)piVar3[lVar10 + 2]; lVar12 = lVar12 + 1) {
            pGVar2 = p->pAig;
            iVar4 = Abc_Lit2Var(piVar3[lVar10 + lVar12]);
            pGVar8 = Gia_ManObj(pGVar2,iVar4);
            Tas_VarDecLevel(p,pGVar8);
            if ((pGVar8->field_0x3 & 0x40) == 0) {
              __assert_fail("Tas_VarIsAssigned( pReason )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x322,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            iVar4 = Tas_LitIsTrue(pGVar8,piVar3[lVar10 + lVar12]);
            if (iVar4 != 0) {
              __assert_fail("!Tas_LitIsTrue( pReason, pCls->pLits[j] )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x323,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            Tas_QuePush(p_00,pGVar8);
          }
        }
        else {
          if (pGVar8->Value == 0xffffffff) {
            __assert_fail("pVar->Value != ~0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x84,"Gia_Obj_t *Tas_VarReason0(Tas_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = Vec_IntEntry(p->vLevReas,pGVar8->Value * 3 + 1);
          if (iVar4 == 0) {
            ppGVar6 = (p->pClauses).pData;
            lVar10 = (long)(p->pClauses).iHead;
            if ((Level != 0) && (ppGVar6[lVar10] != (Gia_Obj_t *)0x0)) {
              __assert_fail("pQue->pData[pQue->iHead] == NULL || Level == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x32c,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            if (ppGVar6[lVar10] == (Gia_Obj_t *)0x0) goto LAB_0057259b;
          }
          else {
            Tas_QuePush(p_00,pGVar8 + iVar4);
            if (pGVar8->Value == 0xffffffff) {
              __assert_fail("pVar->Value != ~0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x85,"Gia_Obj_t *Tas_VarReason1(Tas_Man_t *, Gia_Obj_t *)");
            }
            iVar4 = Vec_IntEntry(p->vLevReas,pGVar8->Value * 3 + 2);
            if (iVar4 == 0) goto LAB_00572751;
            pGVar8 = pGVar8 + iVar4;
          }
          Tas_QuePush(p_00,pGVar8);
        }
      }
    }
LAB_00572751:
    lVar11 = lVar11 + 1;
    iVar4 = (p->pClauses).iTail;
  } while( true );
}

Assistant:

static inline void Tas_ManDeriveReason( Tas_Man_t * p, int Level )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, j, iLitLevel, iLitLevel2;//, Id;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fPhase == 0 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Vec_PtrPush( p->vTemp, pObj );
        // bump activity
//        Id = Gia_ObjId( p->pAig, pObj );
//        if ( p->pActivity[Id] == 0.0 )
//            Vec_IntPush( p->vActiveVars, Id );
//        p->pActivity[Id] += p->Pars.VarInc;
        // check decision level
        iLitLevel = Tas_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        if ( Tas_VarHasReasonCls( p, pObj ) )
        {
            Tas_Cls_t * pCls = Tas_VarReasonCls( p, pObj );
            pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[0]) );
            assert( pReason == pObj );
            for ( j = 1; j < pCls->nLits; j++ )
            {
                pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[j]) );
                iLitLevel2 = Tas_VarDecLevel( p, pReason );
                assert( Tas_VarIsAssigned( pReason ) );
                assert( !Tas_LitIsTrue( pReason, pCls->pLits[j] ) );
                Tas_QuePush( pQue, pReason );
            }
        }
        else
        {
            pReason = Tas_VarReason0( p, pObj );
            if ( pReason == pObj ) // no reason
            {
                assert( pQue->pData[pQue->iHead] == NULL || Level == 0 );
                if ( pQue->pData[pQue->iHead] == NULL )
                    pQue->pData[pQue->iHead] = pObj;
                else
                    Tas_QuePush( pQue, pObj );
                continue;
            }
            Tas_QuePush( pQue, pReason );
            pReason = Tas_VarReason1( p, pObj );
            if ( pReason != pObj ) // second reason
                Tas_QuePush( pQue, pReason );
        }
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    if ( pQue->pData[pQue->iHead] == NULL )
        printf( "Tas_ManDeriveReason(): Failed to derive the clause!!!\n" );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fPhase = 0;
}